

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForkJoin.cpp
# Opt level: O3

vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> * __thiscall
dg::ForkJoinAnalysis::joinFunctions
          (vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> *__return_storage_ptr__
          ,ForkJoinAnalysis *this,Value *joinVal)

{
  pointer *pppVVar1;
  iterator __position;
  long lVar2;
  _Rb_tree_node_base *p_Var3;
  raw_ostream *this_00;
  Value *llvmFunction;
  Value *local_58;
  _Rb_tree<dg::pta::PSNode_*,_dg::pta::PSNode_*,_std::_Identity<dg::pta::PSNode_*>,_std::less<dg::pta::PSNode_*>,_std::allocator<dg::pta::PSNode_*>_>
  local_50;
  
  lVar2 = *(long *)this;
  if (*(int *)(lVar2 + 0x70) != 3) {
    (__return_storage_ptr__->
    super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    lVar2 = dg::pta::LLVMPointerGraphBuilder::findJoin(*(CallInst **)(lVar2 + 0x88));
    std::
    _Rb_tree<dg::pta::PSNode_*,_dg::pta::PSNode_*,_std::_Identity<dg::pta::PSNode_*>,_std::less<dg::pta::PSNode_*>,_std::allocator<dg::pta::PSNode_*>_>
    ::_Rb_tree(&local_50,
               (_Rb_tree<dg::pta::PSNode_*,_dg::pta::PSNode_*,_std::_Identity<dg::pta::PSNode_*>,_std::less<dg::pta::PSNode_*>,_std::allocator<dg::pta::PSNode_*>_>
                *)(lVar2 + 0x120));
    for (p_Var3 = local_50._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != &local_50._M_impl.super__Rb_tree_header;
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
      local_58 = *(Value **)(*(long *)(p_Var3 + 1) + 0x18);
      __position._M_current =
           (__return_storage_ptr__->
           super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<llvm::Value_const*,std::allocator<llvm::Value_const*>>::
        _M_realloc_insert<llvm::Value_const*const&>
                  ((vector<llvm::Value_const*,std::allocator<llvm::Value_const*>> *)
                   __return_storage_ptr__,__position,&local_58);
      }
      else {
        *__position._M_current = local_58;
        pppVVar1 = &(__return_storage_ptr__->
                    super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppVVar1 = *pppVVar1 + 1;
      }
    }
    std::
    _Rb_tree<dg::pta::PSNode_*,_dg::pta::PSNode_*,_std::_Identity<dg::pta::PSNode_*>,_std::less<dg::pta::PSNode_*>,_std::allocator<dg::pta::PSNode_*>_>
    ::_M_erase(&local_50,(_Link_type)local_50._M_impl.super__Rb_tree_header._M_header._M_parent);
    return __return_storage_ptr__;
  }
  this_00 = (raw_ostream *)llvm::errs();
  llvm::raw_ostream::operator<<(this_00,"ForkJoin analysis does not support SVF yet\n");
  abort();
}

Assistant:

std::vector<const llvm::Value *>
ForkJoinAnalysis::joinFunctions(const llvm::Value *joinVal) {
    using namespace llvm;

    if (_PTA->getOptions().isSVF()) {
        errs() << "ForkJoin analysis does not support SVF yet\n";
        abort();
    }

    auto *dgPTA = static_cast<DGLLVMPointerAnalysis *>(_PTA);
    std::vector<const llvm::Value *> threads;

    auto *const builder = dgPTA->getBuilder();
    const auto *const joinCall = cast<CallInst>(joinVal);
    auto *const joinNode = builder->findJoin(joinCall);
    for (auto *const function : joinNode->functions()) {
        auto *const llvmFunction = function->getUserData<llvm::Value>();
        assert(isa<Function>(llvmFunction));
        threads.push_back(llvmFunction);
    }

    return threads;
}